

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O2

void test_find_peaks_out_hw(void)

{
  runtime_error *this;
  int counts;
  int peaks [20];
  float input [16];
  
  input[4] = 0.0;
  input[5] = 0.0;
  input[0xe] = 0.0;
  input[0xf] = 0.0;
  input[8] = 0.0;
  input[9] = 0.0;
  input[10] = 0.0;
  input[0xb] = 0.0;
  input[0] = 0.0;
  input[1] = 0.0;
  input[2] = 0.0;
  input[3] = 0.0;
  input[6] = 3.0;
  input[7] = 0.0;
  input[0xc] = 1.0;
  input[0xd] = 0.0;
  trt_pose::parse::find_peaks_out_hw(&counts,peaks,input,4,4,10,2.0,3);
  if (counts == 1) {
    if (peaks[0] == 1) {
      if (peaks[1] == 2) {
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Peak j coordinate should be 2,");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Peak i coordinate should be 1.");
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Number of peaks should be 1.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_find_peaks_out_hw()
{
  const int H = 4;
  const int W = 4;
  const int M = 10;
  const float threshold = 2.0;
  const int window_size = 3;

  int counts;
  int peaks[M * 2];
  const float input[H * W] = {

    0., 0., 0., 0.,
    0., 0., 3., 0.,
    0., 0., 0., 0.,
    1., 0., 0., 0.

  };

  find_peaks_out_hw(&counts, peaks, input, H, W, M, threshold, window_size);

  if (counts != 1) {
    throw std::runtime_error("Number of peaks should be 1.");
  }
  if (peaks[0] != 1) {
    throw std::runtime_error("Peak i coordinate should be 1.");
  }
  if (peaks[1] != 2) {
    throw std::runtime_error("Peak j coordinate should be 2,");
  }
}